

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  cmGlobalGenerator *pcVar3;
  pointer pcVar4;
  cmSourceFile *this_00;
  iterator __position;
  _Alloc_hider __s1;
  size_type __n;
  cmTarget *pcVar5;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  cmSystemTools *this_01;
  _Rb_tree_node_base *p_Var12;
  long *plVar13;
  size_t sVar14;
  ostream *poVar15;
  pointer ppcVar16;
  string *psVar17;
  vector<cmTarget_const*,std::allocator<cmTarget_const*>> *this_02;
  iterator iVar18;
  mapped_type *__x;
  mapped_type *this_03;
  size_type *psVar19;
  pointer pbVar20;
  _Hash_node_base *p_Var21;
  pointer ppcVar22;
  _Base_ptr p_Var23;
  cmMakefile *pcVar24;
  pointer pbVar25;
  string fullPath;
  all_files_map_t allFiles;
  string lang;
  string compiler;
  string unitFiles;
  string virtualFolders;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  string make;
  Tree tree;
  cmGeneratedFileStream fout;
  string local_430;
  undefined1 local_410 [32];
  _Rb_tree_node_base *local_3f0;
  size_t local_3e8;
  cmTarget *local_3e0;
  string local_3d8;
  undefined1 local_3b8 [40];
  cmMakefile *local_390;
  undefined1 local_388 [32];
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_368;
  cmMakefile *local_360;
  string local_358;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_338;
  cmTarget *local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  long *local_2f8 [2];
  long local_2e8 [2];
  pointer local_2d8;
  cmMakefile *local_2d0;
  Tree local_2c8;
  undefined1 local_278 [584];
  
  pcVar24 = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    local_2c8.path._M_dataplus._M_p = (pointer)&local_2c8.path.field_2;
    local_2c8.path._M_string_length = 0;
    local_2c8.path.field_2._M_local_buf[0] = '\0';
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar3 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var12 = (pcVar3->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_3e0 = (cmTarget *)this;
    local_390 = pcVar24;
    local_368 = lgs;
    if ((_Rb_tree_header *)p_Var12 != &(pcVar3->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      do {
        local_388._0_8_ = (pointer)0x0;
        local_388._8_8_ = (pointer)0x0;
        local_388._16_8_ = (pointer)0x0;
        p_Var23 = *(_Base_ptr *)(p_Var12 + 2);
        if (p_Var23 != p_Var12[2]._M_parent) {
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_388,local_388._8_8_,
                       *(undefined8 *)(*(long *)(*(long *)p_Var23 + 0x28) + 0x188),
                       *(undefined8 *)(*(long *)(*(long *)p_Var23 + 0x28) + 400));
            p_Var23 = (_Base_ptr)&p_Var23->_M_parent;
          } while (p_Var23 != p_Var12[2]._M_parent);
        }
        local_410._0_8_ = local_410 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_ROOT","");
        pcVar9 = cmMakefile::GetDefinition(local_390,(string *)local_410);
        pbVar20 = (pointer)local_388._0_8_;
        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
          pbVar20 = (pointer)local_388._0_8_;
        }
        for (; pbVar20 != (pointer)local_388._8_8_; pbVar20 = pbVar20 + 1) {
          pcVar10 = (char *)strlen(pcVar9);
          lVar11 = std::__cxx11::string::find((char *)pbVar20,(ulong)pcVar9,0);
          if (lVar11 != 0) {
            this_01 = (cmSystemTools *)
                      cmMakefile::GetHomeDirectory
                                (*(cmMakefile **)(**(long **)(p_Var12 + 2) + 0x28));
            cmSystemTools::RelativePath_abi_cxx11_
                      ((string *)local_410,this_01,(pbVar20->_M_dataplus)._M_p,pcVar10);
            local_3b8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_3b8._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_3b8._16_8_ = (pointer)0x0;
            cmsys::SystemTools::SplitPath
                      ((string *)local_410,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3b8,false);
            pcVar4 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_3b8._8_8_ + -0x20))->_M_dataplus)._M_p;
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_358,pcVar4,
                       pcVar4 + ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_3b8._8_8_ + -0x20))->_M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_3b8._8_8_ + -0x20),(iterator)local_3b8._8_8_);
            if ((local_3b8._8_8_ != local_3b8._0_8_) &&
               (lVar11 = std::__cxx11::string::find((char *)local_410,0x4f2a01,0), lVar11 == -1)) {
              Tree::InsertPath(&local_2c8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3b8,1,&local_358);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,
                              CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                                       local_358.field_2._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3b8);
            if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
              operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_388);
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 !=
               (local_3e0->Properties).
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 5);
    }
    pcVar5 = local_3e0;
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_358._M_string_length = 0;
    local_358.field_2._M_local_buf[0] = '\0';
    Tree::BuildVirtualFolder(&local_2c8,&local_358);
    pcVar24 = local_390;
    local_388._0_8_ = local_388 + 0x10;
    local_388._8_8_ = (pointer)0x0;
    local_388._16_8_ = local_388._16_8_ & 0xffffffffffffff00;
    pcVar9 = cmMakefile::GetHomeDirectory(local_390);
    std::__cxx11::string::string((string *)local_3b8,pcVar9,(allocator *)local_2f8);
    plVar13 = (long *)std::__cxx11::string::append(local_3b8);
    pcVar4 = local_410 + 0x10;
    psVar19 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar19) {
      local_410._16_8_ = *psVar19;
      local_410._24_8_ = plVar13[3];
      local_410._0_8_ = pcVar4;
    }
    else {
      local_410._16_8_ = *psVar19;
      local_410._0_8_ = (size_type *)*plVar13;
    }
    local_410._8_8_ = plVar13[1];
    *plVar13 = (long)psVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    Tree::BuildUnit(&local_2c8,(string *)local_388,(string *)local_410);
    if ((pointer)local_410._0_8_ != pcVar4) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    GetCBCompilerId_abi_cxx11_((string *)local_3b8,(cmExtraCodeBlocksGenerator *)pcVar5,pcVar24);
    local_410._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_MAKE_PROGRAM","");
    pcVar9 = cmMakefile::GetRequiredDefinition(pcVar24,(string *)local_410);
    std::__cxx11::string::string((string *)local_2f8,pcVar9,(allocator *)&local_3d8);
    if ((pointer)local_410._0_8_ != pcVar4) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n<CodeBlocks_project_file>\n   <FileVersion major=\"1\" minor=\"6\" />\n   <Project>\n      <Option title=\""
               ,0x9c);
    pcVar9 = (pcVar24->ProjectName)._M_dataplus._M_p;
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)(&stack0xfffffffffffffbc8 +
                           (long)*(_func_int **)(local_278._0_8_ + -0x18)) + 0x1c0);
    }
    else {
      sVar14 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar9,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "\" />\n      <Option makefile_is_custom=\"1\" />\n      <Option compiler=\"",0x45);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,(char *)local_3b8._0_8_,local_3b8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" />\n      ",0xb);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_358._M_dataplus._M_p,local_358._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n      <Build>\n",0xf);
    local_410._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"all","");
    pvVar6 = local_368;
    AppendTarget((cmExtraCodeBlocksGenerator *)pcVar5,(cmGeneratedFileStream *)local_278,
                 (string *)local_410,(cmTarget *)0x0,(char *)local_2f8[0],
                 *(local_368->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,(char *)local_3b8._0_8_);
    if ((pointer)local_410._0_8_ != pcVar4) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    ppcVar16 = (pvVar6->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar16 !=
        (pvVar6->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_360 = (*ppcVar16)->Makefile;
        for (p_Var21 = (local_360->Targets)._M_h._M_before_begin._M_nxt;
            p_Var21 != (_Hash_node_base *)0x0; p_Var21 = p_Var21->_M_nxt) {
          psVar17 = (string *)(p_Var21 + 1);
          uVar2 = *(uint *)&p_Var21[0x61]._M_nxt;
          if (uVar2 < 5) {
            AppendTarget((cmExtraCodeBlocksGenerator *)local_3e0,(cmGeneratedFileStream *)local_278,
                         psVar17,(cmTarget *)(p_Var21 + 5),(char *)local_2f8[0],*ppcVar16,
                         (char *)local_3b8._0_8_);
            local_410._0_8_ = local_410 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_410,p_Var21[1]._M_nxt,
                       (long)&(p_Var21[1]._M_nxt)->_M_nxt + (long)&(p_Var21[2]._M_nxt)->_M_nxt);
            std::__cxx11::string::append((char *)local_410);
            AppendTarget((cmExtraCodeBlocksGenerator *)local_3e0,(cmGeneratedFileStream *)local_278,
                         (string *)local_410,(cmTarget *)(p_Var21 + 5),(char *)local_2f8[0],
                         *ppcVar16,(char *)local_3b8._0_8_);
            if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
              operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
            }
          }
          else if (uVar2 == 5) {
            lVar11 = std::__cxx11::string::find((char *)psVar17,0x510b9c,0);
            if (((lVar11 != 0) ||
                (iVar8 = std::__cxx11::string::compare((char *)psVar17), iVar8 == 0)) &&
               ((lVar11 = std::__cxx11::string::find((char *)psVar17,0x510ba4,0), lVar11 != 0 ||
                (iVar8 = std::__cxx11::string::compare((char *)psVar17), iVar8 == 0)))) {
              lVar11 = std::__cxx11::string::find((char *)psVar17,0x510baf,0);
              if (lVar11 == 0) {
                iVar8 = std::__cxx11::string::compare((char *)psVar17);
                goto LAB_003ba68b;
              }
LAB_003ba6e6:
              AppendTarget((cmExtraCodeBlocksGenerator *)local_3e0,
                           (cmGeneratedFileStream *)local_278,psVar17,(cmTarget *)0x0,
                           (char *)local_2f8[0],*ppcVar16,(char *)local_3b8._0_8_);
            }
          }
          else if (uVar2 == 6) {
            pcVar9 = cmMakefile::GetCurrentBinaryDirectory(local_360);
            pcVar10 = cmMakefile::GetHomeOutputDirectory(local_360);
            iVar8 = strcmp(pcVar9,pcVar10);
LAB_003ba68b:
            if (iVar8 == 0) goto LAB_003ba6e6;
          }
        }
        ppcVar16 = ppcVar16 + 1;
      } while (ppcVar16 !=
               (local_368->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"      </Build>\n",0xf);
    local_410._24_8_ = local_410 + 8;
    local_410._8_8_ = local_410._8_8_ & 0xffffffff00000000;
    local_410._16_8_ = 0;
    local_3e8 = 0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    ppcVar16 = (local_368->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_3f0 = (_Rb_tree_node_base *)local_410._24_8_;
    if (ppcVar16 !=
        (local_368->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_2d0 = (*ppcVar16)->Makefile;
        pcVar24 = (cmMakefile *)(local_2d0->Targets)._M_h._M_before_begin._M_nxt;
        local_2d8 = ppcVar16;
        while( true ) {
          if (pcVar24 == (cmMakefile *)0x0) break;
          if (*(uint *)&(pcVar24->SourceGroups).
                        super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage < 6) {
            local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_430,"CMAKE_BUILD_TYPE","");
            pcVar9 = cmMakefile::GetSafeDefinition(local_2d0,&local_430);
            std::__cxx11::string::string((string *)&local_3d8,pcVar9,(allocator *)&local_320);
            local_3e0 = (cmTarget *)
                        &(pcVar24->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_right;
            cmTarget::GetSourceFiles(local_3e0,&local_338,&local_3d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1
                             );
            }
            ppcVar22 = local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            local_360 = pcVar24;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430._M_dataplus._M_p != &local_430.field_2) {
              operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1
                             );
              ppcVar22 = local_338.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
            }
            while( true ) {
              if (ppcVar22 ==
                  local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) break;
              this_00 = *ppcVar22;
              local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"GENERATED","");
              bVar7 = cmSourceFile::GetPropertyAsBool(this_00,&local_3d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                operator_delete(local_3d8._M_dataplus._M_p,
                                local_3d8.field_2._M_allocated_capacity + 1);
              }
              if (!bVar7) {
                cmSourceFile::GetLanguage_abi_cxx11_(&local_3d8,*ppcVar22);
                iVar8 = std::__cxx11::string::compare((char *)&local_3d8);
                if ((iVar8 == 0) ||
                   (iVar8 = std::__cxx11::string::compare((char *)&local_3d8), iVar8 == 0)) {
                  psVar17 = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar22);
                  pcVar4 = (psVar17->_M_dataplus)._M_p;
                  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_430,pcVar4,pcVar4 + psVar17->_M_string_length);
                  __n = local_430._M_string_length;
                  __s1._M_p = local_430._M_dataplus._M_p;
                  pbVar20 = (local_390->SourceFileExtensions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar25 = (local_390->SourceFileExtensions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  while ((bVar7 = pbVar20 != pbVar25, bVar7 &&
                         ((__n != pbVar20->_M_string_length ||
                          ((__n != 0 &&
                           (iVar8 = bcmp(__s1._M_p,(pbVar20->_M_dataplus)._M_p,__n), iVar8 != 0)))))
                         )) {
                    pbVar20 = pbVar20 + 1;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_430._M_dataplus._M_p != &local_430.field_2) {
                    operator_delete(local_430._M_dataplus._M_p,
                                    local_430.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  bVar7 = false;
                }
                pcVar5 = local_3e0;
                psVar17 = cmSourceFile::GetFullPath(*ppcVar22,(string *)0x0);
                pcVar4 = (psVar17->_M_dataplus)._M_p;
                local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_430,pcVar4,pcVar4 + psVar17->_M_string_length);
                if (bVar7) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_318,&local_430);
                }
                this_02 = (vector<cmTarget_const*,std::allocator<cmTarget_const*>> *)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                        *)local_410,&local_430);
                local_320 = pcVar5;
                __position._M_current = *(cmTarget ***)(this_02 + 8);
                if (__position._M_current == *(cmTarget ***)(this_02 + 0x10)) {
                  std::vector<cmTarget_const*,std::allocator<cmTarget_const*>>::
                  _M_realloc_insert<cmTarget_const*>(this_02,__position,&local_320);
                }
                else {
                  *__position._M_current = pcVar5;
                  *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_430._M_dataplus._M_p != &local_430.field_2) {
                  operator_delete(local_430._M_dataplus._M_p,
                                  local_430.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                  operator_delete(local_3d8._M_dataplus._M_p,
                                  local_3d8.field_2._M_allocated_capacity + 1);
                }
              }
              ppcVar22 = ppcVar22 + 1;
            }
            pcVar24 = local_360;
            if (local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_338.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_338.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_338.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              pcVar24 = local_360;
            }
          }
          pcVar24 = (cmMakefile *)(pcVar24->Internal).x_;
        }
        ppcVar16 = local_2d8 + 1;
      } while (ppcVar16 !=
               (local_368->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_430.field_2;
      pbVar20 = local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::GetFilenamePath(&local_3d8,pbVar20);
        std::__cxx11::string::append((char *)&local_3d8);
        cmsys::SystemTools::GetFilenameWithoutExtension(&local_430,pbVar20);
        std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)local_430._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != paVar1) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        for (pbVar25 = (local_390->HeaderFileExtensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar25 !=
            (local_390->HeaderFileExtensions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar25 = pbVar25 + 1) {
          local_430._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_430,local_3d8._M_dataplus._M_p,
                     local_3d8._M_dataplus._M_p + local_3d8._M_string_length);
          std::__cxx11::string::append((char *)&local_430);
          std::__cxx11::string::_M_append((char *)&local_430,(ulong)(pbVar25->_M_dataplus)._M_p);
          iVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                           *)local_410,&local_430);
          if (iVar18._M_node != (_Base_ptr)(local_410 + 8)) {
LAB_003bac37:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430._M_dataplus._M_p != paVar1) {
              operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1
                             );
            }
            break;
          }
          bVar7 = cmsys::SystemTools::FileExists(local_430._M_dataplus._M_p);
          if (bVar7) {
            __x = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                *)local_410,pbVar20);
            this_03 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                    *)local_410,&local_430);
            std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::operator=
                      (&this_03->Targets,&__x->Targets);
            goto LAB_003bac37;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p != paVar1) {
            operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        pbVar20 = pbVar20 + 1;
      } while (pbVar20 !=
               local_318.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((_Rb_tree_node_base *)local_410._24_8_ != (_Rb_tree_node_base *)(local_410 + 8)) {
      p_Var12 = (_Rb_tree_node_base *)local_410._24_8_;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"      <Unit filename=\"",0x16);
        cmXMLSafe::cmXMLSafe((cmXMLSafe *)&local_3d8,(string *)(p_Var12 + 1));
        poVar15 = operator<<((ostream *)local_278,(cmXMLSafe *)&local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\">\n",3);
        for (p_Var23 = *(_Base_ptr *)(p_Var12 + 2); p_Var23 != p_Var12[2]._M_parent;
            p_Var23 = (_Base_ptr)&p_Var23->_M_parent) {
          lVar11 = *(long *)p_Var23;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"         <Option target=\"",0x19);
          cmXMLSafe::cmXMLSafe((cmXMLSafe *)&local_3d8,(string *)(lVar11 + 0x1a8));
          poVar15 = operator<<((ostream *)local_278,(cmXMLSafe *)&local_3d8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"/>\n",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"      </Unit>\n",0xe);
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != (_Rb_tree_node_base *)(local_410 + 8));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,(char *)local_388._0_8_,local_388._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"   </Project>\n</CodeBlocks_project_file>\n",0x29);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_318);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                 *)local_410);
    if (local_2f8[0] != local_2e8) {
      operator_delete(local_2f8[0],local_2e8[0] + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    if ((pointer)local_388._0_8_ != (pointer)(local_388 + 0x10)) {
      operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                               local_358.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8.files);
    std::vector<Tree,_std::allocator<Tree>_>::~vector(&local_2c8.folders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.path._M_dataplus._M_p != &local_2c8.path.field_2) {
      operator_delete(local_2c8.path._M_dataplus._M_p,
                      CONCAT71(local_2c8.path.field_2._M_allocated_capacity._1_7_,
                               local_2c8.path.field_2._M_local_buf[0]) + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator
  ::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                         const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  Tree tree;

  // build tree of virtual folders
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
          it = this->GlobalGenerator->GetProjectMap().begin();
         it != this->GlobalGenerator->GetProjectMap().end();
         ++it)
    {
    // Collect all files
    std::vector<std::string> listFiles;
    for (std::vector<cmLocalGenerator *>::const_iterator
         jt = it->second.begin();
         jt != it->second.end();
         ++jt)
      {
      const std::vector<std::string> & files =
                                          (*jt)->GetMakefile()->GetListFiles();
      listFiles.insert(listFiles.end(), files.begin(), files.end());
      }

    // Convert
    const char* cmakeRoot = mf->GetDefinition("CMAKE_ROOT");
    for (std::vector<std::string>::const_iterator jt = listFiles.begin();
         jt != listFiles.end();
         ++jt)
      {
      // don't put cmake's own files into the project (#12110):
      if (jt->find(cmakeRoot) == 0)
        {
        continue;
        }

      const std::string &relative = cmSystemTools::RelativePath(
                         it->second[0]->GetMakefile()->GetHomeDirectory(),
                         jt->c_str());
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end()-1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      if (splitted.size() >= 1
          && relative.find("CMakeFiles") == std::string::npos)
        {
        tree.InsertPath(splitted, 1, fileName);
        }
      }
    }

  // Now build a virtual tree string
  std::string virtualFolders;
  tree.BuildVirtualFolder(virtualFolders);
  // And one for <Unit>
  std::string unitFiles;
  tree.BuildUnit(unitFiles, std::string(mf->GetHomeDirectory()) + "/");

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");

  fout<<"<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n"
        "<CodeBlocks_project_file>\n"
        "   <FileVersion major=\"1\" minor=\"6\" />\n"
        "   <Project>\n"
        "      <Option title=\"" << mf->GetProjectName()<<"\" />\n"
        "      <Option makefile_is_custom=\"1\" />\n"
        "      <Option compiler=\"" << compiler << "\" />\n"
        "      "<<virtualFolders<<"\n"
        "      <Build>\n";

  this->AppendTarget(fout, "all", 0, make.c_str(), lgs[0], compiler.c_str());

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp(makefile->GetCurrentBinaryDirectory(),
                     makefile->GetHomeOutputDirectory())==0)
            {
            this->AppendTarget(fout, ti->first, 0,
                               make.c_str(), *lg, compiler.c_str());
            }
          }
          break;
        case cmTarget::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((ti->first.find("Nightly")==0)   &&(ti->first!="Nightly"))
             || ((ti->first.find("Continuous")==0)&&(ti->first!="Continuous"))
             || ((ti->first.find("Experimental")==0)
                                               && (ti->first!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, ti->first, 0,
                                 make.c_str(), *lg, compiler.c_str());
          break;
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
          {
          this->AppendTarget(fout, ti->first, &ti->second,
                             make.c_str(), *lg, compiler.c_str());
          std::string fastTarget = ti->first;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, &ti->second,
                             make.c_str(), *lg, compiler.c_str());
          }
          break;
        default:
          break;
        }
      }
    }

  fout<<"      </Build>\n";


  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an acompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
        case cmTarget::UTILITY: // can have sources since 2.6.3
          {
          std::vector<cmSourceFile*> sources;
          ti->second.GetSourceFiles(sources,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
               si!=sources.end(); si++)
            {
            // don't add source files which have the GENERATED property set:
            if ((*si)->GetPropertyAsBool("GENERATED"))
              {
              continue;
              }

            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX")
              {
              std::string srcext = (*si)->GetExtension();
              for(std::vector<std::string>::const_iterator
                  ext = mf->GetSourceExtensions().begin();
                  ext !=  mf->GetSourceExtensions().end();
                  ++ext)
                {
                if (srcext == *ext)
                  {
                  isCFile = true;
                  break;
                  }
                }
              }

            std::string fullPath = (*si)->GetFullPath();

            if(isCFile)
              {
              cFiles.push_back(fullPath);
              }

            CbpUnit &cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(&(ti->second));
            }
          }
        default:  // intended fallthrough
          break;
        }
      }
    }

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::vector<std::string>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string const& fileName = *sit;
    std::string headerBasename=cmSystemTools::GetFilenamePath(fileName);
    headerBasename+="/";
    headerBasename+=cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for(std::vector<std::string>::const_iterator
        ext = mf->GetHeaderExtensions().begin();
        ext !=  mf->GetHeaderExtensions().end();
        ++ext)
      {
      std::string hname=headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end())
        {
        break;
        }

      if(cmSystemTools::FileExists(hname.c_str()))
        {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
        }
      }
    }

  // insert all source files in the CodeBlocks project
  for (all_files_map_t::const_iterator
       sit=allFiles.begin();
       sit!=allFiles.end();
       ++sit)
    {
    std::string const& unitFilename = sit->first;
    CbpUnit const& unit = sit->second;

    fout<<"      <Unit filename=\""<< cmXMLSafe(unitFilename) <<"\">\n";

    for(std::vector<const cmTarget*>::const_iterator ti = unit.Targets.begin();
      ti != unit.Targets.end(); ++ti)
      {
      std::string const& targetName = (*ti)->GetName();
      fout<<"         <Option target=\""<< cmXMLSafe(targetName) <<"\"/>\n";
      }

    fout<<"      </Unit>\n";
    }

  // Add CMakeLists.txt
  fout<<unitFiles;

  fout<<"   </Project>\n"
        "</CodeBlocks_project_file>\n";
}